

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O1

void __thiscall asmjit::BaseEmitter::setErrorHandler(BaseEmitter *this,ErrorHandler *errorHandler)

{
  if (errorHandler == (ErrorHandler *)0x0) {
    this->_errorHandler = (ErrorHandler *)0x0;
    this->_emitterFlags = this->_emitterFlags & 0xdf;
    if (this->_code != (CodeHolder *)0x0) {
      this->_errorHandler = this->_code->_errorHandler;
      return;
    }
  }
  else {
    this->_errorHandler = errorHandler;
    this->_emitterFlags = this->_emitterFlags | 0x20;
  }
  return;
}

Assistant:

void BaseEmitter::setErrorHandler(ErrorHandler* errorHandler) noexcept {
  if (errorHandler) {
    _errorHandler = errorHandler;
    _addEmitterFlags(kFlagOwnErrorHandler);
  }
  else {
    _errorHandler = nullptr;
    _clearEmitterFlags(kFlagOwnErrorHandler);
    if (_code)
      _errorHandler = _code->errorHandler();
  }
}